

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_debug.c
# Opt level: O1

char * find_hooked_symbol(void)

{
  uint uVar1;
  void *__ptr;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  apprun_path_mapping **__s;
  size_t sVar5;
  apprun_path_mapping **ppaVar6;
  apprun_path_mapping *paVar7;
  apprun_path_mapping **ppaVar8;
  int iVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  void *buffer [100];
  undefined1 auStack_358 [808];
  
  uVar1 = backtrace(auStack_358,100);
  __ptr = (void *)backtrace_symbols(auStack_358,uVar1);
  if (__ptr == (void *)0x0) {
    find_hooked_symbol_cold_1();
    __s = (apprun_path_mapping **)getenv("APPDIR_PATH_MAPPINGS");
    ppaVar8 = __s;
    if ((__s != (apprun_path_mapping **)0x0) &&
       (apprun_path_mappings == (apprun_path_mapping **)0x0)) {
      sVar5 = strlen((char *)__s);
      if (sVar5 != 0) {
        sVar10 = 0;
        iVar9 = apprun_path_mappings_size;
        do {
          if (*(char *)((long)__s + sVar10) == ';') {
            iVar9 = iVar9 + 1;
            apprun_path_mappings_size = iVar9;
          }
          sVar10 = sVar10 + 1;
        } while (sVar5 != sVar10);
      }
      lVar11 = (long)apprun_path_mappings_size;
      ppaVar6 = (apprun_path_mapping **)malloc(lVar11 * 8);
      ppaVar8 = ppaVar6;
      apprun_path_mappings = ppaVar6;
      if (0 < lVar11) {
        lVar13 = 0;
        do {
          pcVar3 = strchr((char *)__s,0x3a);
          pcVar4 = strchr((char *)__s,0x3b);
          ppaVar8 = (apprun_path_mapping **)
                    CONCAT71((int7)((ulong)pcVar4 >> 8),pcVar3 != (char *)0x0);
          if (pcVar4 != (char *)0x0 && pcVar3 != (char *)0x0) {
            paVar7 = (apprun_path_mapping *)malloc(0x10);
            pcVar2 = strndup((char *)__s,(long)pcVar3 - (long)__s);
            paVar7->path = pcVar2;
            pcVar3 = strndup(pcVar3 + 1,(size_t)(pcVar4 + ~(ulong)pcVar3));
            paVar7->mapping = pcVar3;
            ppaVar6[lVar13] = paVar7;
            ppaVar8 = ppaVar6;
          }
          __s = (apprun_path_mapping **)(pcVar4 + 1);
          lVar13 = lVar13 + 1;
        } while (lVar11 != lVar13);
      }
    }
    return (char *)ppaVar8;
  }
  if ((int)uVar1 < 1) {
    pcVar3 = (char *)0x0;
  }
  else {
    uVar12 = 0;
    pcVar3 = (char *)0x0;
    do {
      pcVar4 = *(char **)((long)__ptr + uVar12 * 8);
      pcVar2 = strstr(pcVar4,"libapprun_hooks.so");
      if (((pcVar2 != (char *)0x0) &&
          (pcVar2 = strstr(pcVar4,"__libc_start_main"), pcVar2 == (char *)0x0)) &&
         (pcVar2 = strstr(pcVar4,"main_hook"), pcVar2 == (char *)0x0)) {
        pcVar3 = pcVar4;
      }
      uVar12 = uVar12 + 1;
    } while (uVar1 != uVar12);
  }
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = strchr(pcVar3,0x28);
  }
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strdup("UNKNOWN");
  }
  else {
    pcVar4 = strchr(pcVar3,0x2b);
    pcVar3 = strndup(pcVar3 + 1,(size_t)(pcVar4 + ~(ulong)pcVar3));
    free(__ptr);
  }
  return pcVar3;
}

Assistant:

char *find_hooked_symbol() {
    int nptrs;
    void *buffer[BT_BUF_SIZE];
    char **strings;

    nptrs = backtrace(buffer, BT_BUF_SIZE);

    /* The call backtrace_symbols_fd(buffer, nptrs, STDOUT_FILENO)
       would produce similar output to the following: */

    strings = backtrace_symbols(buffer, nptrs);
    if (strings == NULL) {
        perror("backtrace_symbols");
        exit(EXIT_FAILURE);
    }
    char *apprun_hooks_entry = NULL;
    for (int j = 0; j < nptrs; j++) {
        if ((strstr(strings[j], "libapprun_hooks.so") != NULL)
            && (strstr(strings[j], "__libc_start_main") == NULL)
            && (strstr(strings[j], "main_hook") == NULL)) {
            apprun_hooks_entry = strings[j];
        }
    }

    char *symbol_name_being = apprun_hooks_entry != NULL ? strstr(apprun_hooks_entry, "(") : NULL;

    // symbol name lookup is not perfect, in case of failure just return UNKNOWN
    if (symbol_name_being == NULL)
        return strdup("UNKNOWN");

    char *symbol_name_end = strstr(symbol_name_being, "+");
    char *symbol_name = strndup(symbol_name_being + 1, symbol_name_end - symbol_name_being - 1);

    free(strings);
    return symbol_name;
}